

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O2

xr_writer * __thiscall
xray_re::xr_file_system::w_open(xr_file_system *this,char *path,bool ignore_ro)

{
  bool bVar1;
  FILE *p_FD;
  xr_fake_writer *this_00;
  int *piVar2;
  undefined7 in_register_00000011;
  CPath p;
  CPath ds;
  path local_68;
  path local_40;
  
  CPath::CPath((CPath *)&local_68,path);
  if (((int)CONCAT71(in_register_00000011,ignore_ro) == 0) && ((this->m_flags & 1) != 0)) {
    dbg("fs_ro: writing %s",path);
    this_00 = (xr_fake_writer *)operator_new(0x2068);
    xr_fake_writer::xr_fake_writer(this_00);
  }
  else {
    CPath::make_preferred_abi_cxx11_((CPath *)&local_68);
    p_FD = fopen(local_68._M_pathname._M_dataplus._M_p,"w");
    if (p_FD == (FILE *)0x0) {
      piVar2 = __errno_location();
      if (*piVar2 == 2) {
        std::filesystem::__cxx11::path::path(&local_40,&local_68);
        CPath::remove_filename_abi_cxx11_((CPath *)&local_40);
        bVar1 = CPath::create_directory_recursive((CPath *)&local_40);
        if (bVar1) {
          this_00 = (xr_fake_writer *)w_open(this,local_68._M_pathname._M_dataplus._M_p,ignore_ro);
        }
        else {
          this_00 = (xr_fake_writer *)0x0;
        }
        std::filesystem::__cxx11::path::~path(&local_40);
      }
      else {
        this_00 = (xr_fake_writer *)0x0;
      }
    }
    else {
      this_00 = (xr_fake_writer *)operator_new(0x2060);
      xr_file_writer_posix::xr_file_writer_posix((xr_file_writer_posix *)this_00,(FILE *)p_FD);
    }
  }
  std::filesystem::__cxx11::path::~path(&local_68);
  return &this_00->super_xr_writer;
}

Assistant:

xr_writer* xr_file_system::w_open(const char* path, bool ignore_ro) const
{
FILE* outfile;
CPath p(path);

	if (!ignore_ro && read_only()) {
		dbg("fs_ro: writing %s", path);
		return new xr_fake_writer();
	}

	p.make_preferred();
	outfile = fopen(p.c_str(), "w");
	if(outfile == nullptr)
	{
		if(errno == ENOENT)
		{
			auto ds{p};

			ds.remove_filename();
			if(!ds.create_directory_recursive())
				return nullptr;

			return w_open(p.c_str(), ignore_ro);
		}
		else
		{
			return nullptr;
		}
	}

	xr_writer* w = new xr_file_writer_posix(outfile);

	if(w == nullptr)
		fclose(outfile);

	return w;
}